

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

int Ifd_ManDsdTest33(void)

{
  uint uVar1;
  Vec_Wrd_t *p;
  long lVar2;
  uint i;
  word uTruth;
  int pCounts [6];
  
  p = Ifd_ManDsdTruths(6);
  for (i = 0; (int)i < p->nSize; i = i + 1) {
    uTruth = Vec_WrdEntry(p,i);
    Ifd_ComputeSignature(uTruth,pCounts);
    printf("%5d :  ",(ulong)i);
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      uVar1 = pCounts[lVar2];
      printf("%2d %2d %2d   ",(ulong)(uVar1 >> 0x14 & 0xff),(ulong)(uVar1 >> 10 & 0xff),
             (ulong)(uVar1 & 0xff));
    }
    printf("  ");
    Kit_DsdPrintFromTruth((uint *)&uTruth,6);
    putchar(10);
  }
  Vec_WrdFree(p);
  return 1;
}

Assistant:

int Ifd_ManDsdTest33() 
{
    int nVars = 6;
    Vec_Wrd_t * vTruths = Ifd_ManDsdTruths( nVars );
    int i, v, pCounts[6];
    word uTruth;
    Vec_WrdForEachEntry( vTruths, uTruth, i )
    {
        Ifd_ComputeSignature( uTruth, pCounts );
        // print
        printf( "%5d :  ", i ); 
        for ( v = 0; v < 6; v++ )
            printf( "%2d %2d %2d   ", (pCounts[v] >> 20) & 0xFF, (pCounts[v] >> 10) & 0xFF, (pCounts[v] >> 0) & 0xFF );
        printf( "  " );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, nVars );
        printf( "\n" );
    }
    Vec_WrdFree( vTruths );
    return 1;
}